

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

void __thiscall
duckdb::MultiFileColumnMapper::ThrowColumnNotFoundError
          (MultiFileColumnMapper *this,string *global_column_name)

{
  pointer pMVar1;
  type pBVar2;
  InvalidInputException *this_00;
  MultiFileColumnDefinition *column;
  pointer pMVar3;
  allocator local_119;
  string *local_118;
  string candidate_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118 = global_column_name;
  pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&this->reader_data->reader);
  candidate_names._M_dataplus._M_p = (pointer)&candidate_names.field_2;
  candidate_names._M_string_length = 0;
  candidate_names.field_2._M_local_buf[0] = '\0';
  pMVar1 = (pBVar2->columns).
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (pBVar2->columns).
                super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                .
                super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    if (candidate_names._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)&candidate_names);
    }
    ::std::__cxx11::string::append((string *)&candidate_names);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_70,
             "Failed to read file \"%s\": schema mismatch in glob: column \"%s\" was read from the original file \"%s\", but could not be found in file \"%s\".\nCandidate names: %s\nIf you are trying to read files with different schemas, try setting union_by_name=True"
             ,&local_119);
  ::std::__cxx11::string::string((string *)&local_90,(string *)&pBVar2->file);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)local_118);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)this->initial_file);
  ::std::__cxx11::string::string((string *)&local_f0,(string *)&pBVar2->file);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&candidate_names);
  InvalidInputException::
  InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_70,&local_90,&local_b0,&local_d0,&local_f0,&local_50);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MultiFileColumnMapper::ThrowColumnNotFoundError(const string &global_column_name) const {
	auto &reader = *reader_data.reader;
	auto &local_columns = reader.GetColumns();

	string candidate_names;
	for (auto &column : local_columns) {
		if (!candidate_names.empty()) {
			candidate_names += ", ";
		}
		candidate_names += column.name;
	}
	auto &file_name = reader.GetFileName();
	throw InvalidInputException("Failed to read file \"%s\": schema mismatch in glob: column \"%s\" was read from "
	                            "the original file \"%s\", but could not be found in file \"%s\".\nCandidate names: "
	                            "%s\nIf you are trying to "
	                            "read files with different schemas, try setting union_by_name=True",
	                            file_name, global_column_name, initial_file.path, file_name, candidate_names);
}